

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

optional<helics::ActionMessage> * __thiscall
helics::FederateState::processPostTerminationAction(FederateState *this,ActionMessage *action)

{
  action_t aVar1;
  GlobalFederateId sourceId;
  ActionMessage *in_RDX;
  ActionMessage *in_RSI;
  ActionMessage *in_RDI;
  optional<helics::ActionMessage> *optAct;
  undefined4 in_stack_ffffffffffffff10;
  action_t in_stack_ffffffffffffff14;
  ActionMessage *in_stack_ffffffffffffff18;
  
  std::optional<helics::ActionMessage>::optional((optional<helics::ActionMessage> *)0x4badc5);
  aVar1 = ActionMessage::action(in_RDX);
  if (aVar1 == cmd_request_current_time) {
    sourceId = std::atomic<helics::GlobalFederateId>::load
                         ((atomic<helics::GlobalFederateId> *)
                          ((long)&(in_RSI->Te).internalTimeCode + 4),seq_cst);
    ActionMessage::ActionMessage
              (in_stack_ffffffffffffff18,in_stack_ffffffffffffff14,sourceId,
               (GlobalFederateId)(in_RDX->source_id).gid);
    std::optional<helics::ActionMessage>::operator=
              ((optional<helics::ActionMessage> *)
               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),in_RSI);
    ActionMessage::~ActionMessage(in_RDI);
  }
  return (optional<helics::ActionMessage> *)in_RDI;
}

Assistant:

std::optional<ActionMessage>
    FederateState::processPostTerminationAction(const ActionMessage& action)  // NOLINT
{
    std::optional<ActionMessage> optAct;
    switch (action.action()) {
        case CMD_REQUEST_CURRENT_TIME:
            optAct = ActionMessage(CMD_DISCONNECT, global_id.load(), action.source_id);
            break;
        default:
            break;
    }
    return optAct;
}